

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDataStream.h
# Opt level: O1

void __thiscall KDIS::KDataStream::Read<double>(KDataStream *this,double *T)

{
  ushort uVar1;
  pointer puVar2;
  NetToDataType<double> *pNVar3;
  long lVar4;
  long lVar5;
  NetToDataType<double> OctArray;
  KOCTET Temp [8];
  
  OctArray.m_Value = *T;
  puVar2 = (this->m_vBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar1 = this->m_ui16CurrentWritePos;
  lVar4 = 0;
  do {
    Temp[lVar4 + -8] = puVar2[(uint)uVar1 + (int)lVar4 & 0xffff];
    lVar5 = lVar4 + 1;
    this->m_ui16CurrentWritePos = (short)lVar4 + uVar1 + 1;
    lVar4 = lVar5;
  } while (lVar5 != 8);
  if (this->m_MachineEndian != this->m_NetEndian) {
    pNVar3 = &OctArray;
    Temp = (KOCTET  [8])OctArray;
    lVar4 = 8;
    do {
      (pNVar3->field_0).m_Octs[0] = Temp[lVar4 + -1];
      pNVar3 = (NetToDataType<double> *)((pNVar3->field_0).m_Octs + 1);
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  *T = (double)OctArray;
  return;
}

Assistant:

void KDataStream::Read( Type & T )
{
    NetToDataType<Type> OctArray( T, false );

    // Copy octets into data type
    for( KUINT8 i = 0; i < sizeof T; ++i, ++m_ui16CurrentWritePos )
    {
        OctArray.m_Octs[i] = m_vBuffer[m_ui16CurrentWritePos];
    }

    if( m_MachineEndian != m_NetEndian )
    {
        OctArray.SwapBytes();
    }

    T = OctArray.m_Value;
}